

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void __thiscall
duckdb::StandardColumnWriter<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator>::
WriteVectorInternal<false>
          (StandardColumnWriter<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator> *this,
          WriteStream *temp_writer,ColumnWriterStatistics *stats,ColumnWriterPageState *page_state_p
          ,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  ValidityMask *chunk_end_00;
  undefined1 uVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  idx_t i;
  Allocator *pAVar4;
  long lVar5;
  idx_t iVar6;
  primitive_dictionary_entry_t *ppVar7;
  InternalException *this_00;
  uint *result;
  uint64_t *puVar8;
  hugeint_t *value;
  Vector *mask;
  WriteStream *ser;
  idx_t r;
  idx_t iVar9;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t input_02;
  hugeint_t input_03;
  double target_value;
  string local_58;
  StandardColumnWriter<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator> *local_38;
  
  mask = input_column;
  ser = (WriteStream *)chunk_start;
  local_38 = this;
  FlatVector::VerifyFlatVector(input_column);
  if (9 < *(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
switchD_01be294e_caseD_1:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Unknown encoding","");
    InternalException::InternalException(this_00,&local_58);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  chunk_end_00 = &input_column->validity;
  pdVar2 = input_column->data;
  result = &switchD_01be294e::switchdataD_01e66b40;
  switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    if ((chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) {
      TemplatedWritePlain<duckdb::hugeint_t,double,duckdb::ParquetHugeintOperator,true>
                (input_column,(ColumnWriterStatistics *)chunk_start,chunk_end,(idx_t)temp_writer,
                 (ValidityMask *)mask,ser);
      return;
    }
    TemplatedWritePlain<duckdb::hugeint_t,double,duckdb::ParquetHugeintOperator,false>
              (input_column,(ColumnWriterStatistics *)chunk_start,chunk_end,(idx_t)chunk_end_00,
               (ValidityMask *)temp_writer,ser);
    return;
  default:
    goto switchD_01be294e_caseD_1;
  case 5:
    iVar9 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0')) {
      result = (uint *)(chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar6 = chunk_start;
      do {
        iVar9 = chunk_start;
        if (((double *)result == (double *)0x0) ||
           (iVar9 = iVar6,
           ((ulong)*(double *)((long)result + (iVar6 >> 6) * 8) >> (iVar6 & 0x3f) & 1) != 0)) {
          local_58._M_dataplus._M_p = (pointer)0x0;
          input_02.upper = (int64_t)&local_58;
          input_02.lower = *(uint64_t *)(pdVar2 + iVar9 * 0x10 + 8);
          Hugeint::TryCast<double>(*(Hugeint **)(pdVar2 + iVar9 * 0x10),input_02,(double *)result);
          DbpEncoder::BeginWrite<double>
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(double *)&local_58);
          *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
          iVar9 = iVar9 + 1;
          break;
        }
        iVar6 = iVar6 + 1;
        iVar9 = chunk_end;
      } while (chunk_end != iVar6);
    }
    if (iVar9 < chunk_end) {
      puVar8 = (uint64_t *)(pdVar2 + iVar9 * 0x10 + 8);
      do {
        puVar3 = (chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar3 == (unsigned_long *)0x0) ||
           (result = (uint *)(iVar9 >> 6), (puVar3[(long)result] >> (iVar9 & 0x3f) & 1) != 0)) {
          local_58._M_dataplus._M_p = (pointer)0x0;
          input_03.upper = (int64_t)&local_58;
          input_03.lower = *puVar8;
          Hugeint::TryCast<double>((Hugeint *)puVar8[-1],input_03,(double *)result);
          DbpEncoder::WriteValue<double>
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(double *)&local_58);
        }
        iVar9 = iVar9 + 1;
        puVar8 = puVar8 + 2;
      } while (chunk_end != iVar9);
    }
    break;
  case 6:
    iVar9 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0')) {
      result = (uint *)(chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar6 = chunk_start;
      do {
        iVar9 = chunk_start;
        if (((string *)result == (string *)0x0) ||
           (iVar9 = iVar6,
           ((ulong)(&((string *)result)->_M_dataplus)[iVar6 >> 6]._M_p >> (iVar6 & 0x3f) & 1) != 0))
        {
          local_58._M_dataplus._M_p = (pointer)0x0;
          input_00.upper = (int64_t)&local_58;
          input_00.lower = *(uint64_t *)(pdVar2 + iVar9 * 0x10 + 8);
          Hugeint::TryCast<double>(*(Hugeint **)(pdVar2 + iVar9 * 0x10),input_00,(double *)result);
          pAVar4 = BufferAllocator::Get
                             (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                              context);
          result = (uint *)&local_58;
          DlbaEncoder::BeginWrite<double>
                    ((DlbaEncoder *)(page_state_p + 0x909),pAVar4,temp_writer,(double *)result);
          *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
          iVar9 = iVar9 + 1;
          break;
        }
        iVar6 = iVar6 + 1;
        iVar9 = chunk_end;
      } while (chunk_end != iVar6);
    }
    if (iVar9 < chunk_end) {
      puVar8 = (uint64_t *)(pdVar2 + iVar9 * 0x10 + 8);
      do {
        puVar3 = (chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar3 == (unsigned_long *)0x0) ||
           (result = (uint *)(iVar9 >> 6), (puVar3[(long)result] >> (iVar9 & 0x3f) & 1) != 0)) {
          local_58._M_dataplus._M_p = (pointer)0x0;
          input_01.upper = (int64_t)&local_58;
          input_01.lower = *puVar8;
          Hugeint::TryCast<double>((Hugeint *)puVar8[-1],input_01,(double *)result);
          DlbaEncoder::WriteValue<double>
                    ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,(double *)&local_58);
        }
        iVar9 = iVar9 + 1;
        puVar8 = puVar8 + 2;
      } while (chunk_end != iVar9);
    }
    break;
  case 8:
    iVar9 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0')) {
      puVar3 = (chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar6 = chunk_start;
      do {
        iVar9 = chunk_start;
        if ((puVar3 == (unsigned_long *)0x0) ||
           (iVar9 = iVar6, (puVar3[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) {
          local_58._M_dataplus._M_p._0_1_ =
               *(undefined1 *)((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4);
          (**temp_writer->_vptr_WriteStream)(temp_writer,&local_58,1);
          page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
          break;
        }
        iVar6 = iVar6 + 1;
        iVar9 = chunk_end;
      } while (chunk_end != iVar6);
    }
    if (iVar9 < chunk_end) {
      value = (hugeint_t *)(pdVar2 + iVar9 * 0x10);
      do {
        puVar3 = (chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[iVar9 >> 6] >> (iVar9 & 0x3f) & 1) != 0)) {
          ppVar7 = PrimitiveDictionary<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator>::
                   Lookup((PrimitiveDictionary<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator>
                           *)page_state_p[0x121b]._vptr_ColumnWriterPageState,value);
          local_58._M_dataplus._M_p._0_4_ = ppVar7->index;
          RleBpEncoder::WriteValue
                    ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)&local_58);
        }
        iVar9 = iVar9 + 1;
        value = value + 1;
      } while (chunk_end != iVar9);
    }
    break;
  case 9:
    if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
      pAVar4 = BufferAllocator::Get
                         (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                          context);
      BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar4);
      *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
    }
    if (chunk_start < chunk_end) {
      do {
        puVar3 = (chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar3 == (unsigned_long *)0x0) ||
           (result = (uint *)(chunk_start >> 6),
           (puVar3[(long)result] >> (chunk_start & 0x3f) & 1) != 0)) {
          local_58._M_dataplus._M_p = (pointer)0x0;
          input.upper = (int64_t)&local_58;
          input.lower = *(uint64_t *)(pdVar2 + chunk_start * 0x10 + 8);
          Hugeint::TryCast<double>
                    (*(Hugeint **)(pdVar2 + chunk_start * 0x10),input,(double *)result);
          lVar5 = 0;
          do {
            uVar1 = *(undefined1 *)((long)&local_58._M_dataplus._M_p + lVar5);
            result = (uint *)CONCAT71((int7)((ulong)result >> 8),uVar1);
            *(undefined1 *)
             ((long)page_state_p[0x1217]._vptr_ColumnWriterPageState +
             (long)((long)page_state_p[0x1215]._vptr_ColumnWriterPageState * lVar5 +
                   (long)page_state_p[0x1219]._vptr_ColumnWriterPageState)) = uVar1;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 8);
          page_state_p[0x1217]._vptr_ColumnWriterPageState =
               (_func_int **)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + 1);
        }
        chunk_start = chunk_start + 1;
      } while (chunk_start != chunk_end);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}